

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O3

bool __thiscall sai::VirtualFileSystem::Exists(VirtualFileSystem *this,char *Path)

{
  bool bVar1;
  optional<sai::VirtualFileEntry> oStack_78;
  
  GetEntry(&oStack_78,this,Path);
  bVar1 = oStack_78.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
          super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
          super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged;
  if (oStack_78.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    oStack_78.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
    super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
    super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
    VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)&oStack_78);
  }
  return bVar1;
}

Assistant:

bool VirtualFileSystem::Exists(const char* Path)
{
	return GetEntry(Path).has_value();
}